

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_SetObjectData(JSContext *ctx,JSValue obj,JSValue val)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  JSValueUnion JVar2;
  JSValue JVar3;
  
  JVar2 = obj.u;
  if ((((int)obj.tag == -1) && (*(ushort *)((long)JVar2.ptr + 6) < 0xb)) &&
     ((0x4f0U >> (*(ushort *)((long)JVar2.ptr + 6) & 0x1f) & 1) != 0)) {
    JS_FreeValue(ctx,*(JSValue *)((long)JVar2.ptr + 0x30));
    *(JSValueUnion *)((long)JVar2.ptr + 0x30) = val.u;
    *(int64_t *)((long)JVar2.ptr + 0x38) = val.tag;
    iVar1 = extraout_EAX;
  }
  else {
    JS_FreeValue(ctx,val);
    iVar1 = extraout_EAX_00;
    if ((int)obj.tag != 6) {
      JVar3 = JS_ThrowTypeError(ctx,"invalid object type");
      return JVar3.u._0_4_;
    }
  }
  return iVar1;
}

Assistant:

static int JS_SetObjectData(JSContext *ctx, JSValueConst obj, JSValue val)
{
    JSObject *p;

    if (JS_VALUE_GET_TAG(obj) == JS_TAG_OBJECT) {
        p = JS_VALUE_GET_OBJ(obj);
        switch(p->class_id) {
        case JS_CLASS_NUMBER:
        case JS_CLASS_STRING:
        case JS_CLASS_BOOLEAN:
        case JS_CLASS_SYMBOL:
        case JS_CLASS_DATE:
#ifdef CONFIG_BIGNUM
        case JS_CLASS_BIG_INT:
        case JS_CLASS_BIG_FLOAT:
        case JS_CLASS_BIG_DECIMAL:
#endif
            JS_FreeValue(ctx, p->u.object_data);
            p->u.object_data = val;
            return 0;
        }
    }
    JS_FreeValue(ctx, val);
    if (!JS_IsException(obj))
        JS_ThrowTypeError(ctx, "invalid object type");
    return -1;
}